

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassTemplate.h
# Opt level: O0

void __thiscall
kiste::ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::
render_header<kiste::class_t>
          (ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,size_t line_no
          ,class_t *class_data)

{
  ulong uVar1;
  class_t *class_data_local;
  size_t line_no_local;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  cpp::text(this->_serialize,
            "template<typename DERIVED_T, typename DATA_T, typename SERIALIZER_T>\nstruct ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  cpp::text(this->_serialize,"_t\n");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cpp::text(this->_serialize,"  : public ");
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_parent_name);
    cpp::text(this->_serialize,"_t<");
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_name);
    cpp::text(this->_serialize,"_t<DERIVED_T, DATA_T, SERIALIZER_T>, DATA_T, SERIALIZER_T>\n");
  }
  cpp::text(this->_serialize,"{\n");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cpp::text(this->_serialize,"  using _parent_t = ");
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_parent_name);
    cpp::text(this->_serialize,"_t<");
    cpp::
    escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (this->_serialize,&class_data->_name);
    cpp::text(this->_serialize,"_t, DATA_T, SERIALIZER_T>;\n  _parent_t& parent;\n");
  }
  cpp::text(this->_serialize,
            "  DERIVED_T& child;\n  using _data_t = DATA_T;\n  const _data_t& data;\n  using _serializer_t = SERIALIZER_T;\n  _serializer_t& _serialize;\n\n  "
           );
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (this->_serialize,&class_data->_name);
  cpp::text(this->_serialize,
            "_t(DERIVED_T& derived, const DATA_T& data_, SERIALIZER_T& serialize):\n");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cpp::text(this->_serialize,"    _parent_t{*this, data_, serialize},\n    parent(*this),\n");
  }
  cpp::text(this->_serialize,
            "    child(derived),\n    data(data_),\n    _serialize(serialize)\n  {}\n");
  line_directive(this,line_no + 1);
  cpp::text(this->_serialize,"\n");
  return;
}

Assistant:

void render_header(const size_t line_no, const ClassData& class_data)
    {
    _serialize.text("template<typename DERIVED_T, typename DATA_T, typename SERIALIZER_T>\n"
                    "struct ");_serialize.escape(class_data._name);_serialize.text("_t\n");
      if (!class_data._parent_name.empty())
      {
      _serialize.text("  : public ");_serialize.escape(class_data._parent_name);_serialize.text("_t<");_serialize.escape(class_data._name);_serialize.text("_t<DERIVED_T, DATA_T, SERIALIZER_T>, DATA_T, SERIALIZER_T>\n");
      }
    _serialize.text("{\n");
      if (!class_data._parent_name.empty())
      {
      _serialize.text("  using _parent_t = ");_serialize.escape(class_data._parent_name);_serialize.text("_t<");_serialize.escape(class_data._name);_serialize.text("_t, DATA_T, SERIALIZER_T>;\n"
                      "  _parent_t& parent;\n");
      }
    _serialize.text("  DERIVED_T& child;\n"
                    "  using _data_t = DATA_T;\n"
                    "  const _data_t& data;\n"
                    "  using _serializer_t = SERIALIZER_T;\n"
                    "  _serializer_t& _serialize;\n"
                    "\n"
                    "  ");_serialize.escape(class_data._name);_serialize.text("_t(DERIVED_T& derived, const DATA_T& data_, SERIALIZER_T& serialize):\n");
      if (!class_data._parent_name.empty())
      {
      _serialize.text("    _parent_t{*this, data_, serialize},\n"
                      "    parent(*this),\n");
      }
    _serialize.text("    child(derived),\n"
                    "    data(data_),\n"
                    "    _serialize(serialize)\n"
                    "  {}\n");
    static_assert(std::is_same<decltype(line_directive(line_no + 1)), void>::value, "$call{} requires void expression"); (line_directive(line_no + 1));_serialize.text("\n");
    }